

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSite::~IfcSite(IfcSite *this)

{
  ~IfcSite((IfcSite *)
           &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18);
  return;
}

Assistant:

IfcSite() : Object("IfcSite") {}